

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v9::detail::buffer<wchar_t>::append<wchar_t>(buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  type tVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  for (; begin != end; begin = begin + uVar4) {
    tVar1 = to_unsigned<long>((long)end - (long)begin >> 2);
    sVar2 = this->size_;
    uVar3 = this->capacity_;
    if (uVar3 < sVar2 + tVar1) {
      (**this->_vptr_buffer)(this);
      sVar2 = this->size_;
      uVar3 = this->capacity_;
    }
    uVar4 = uVar3 - sVar2;
    if (tVar1 <= uVar3 - sVar2) {
      uVar4 = tVar1;
    }
    if (uVar4 != 0) {
      memmove(this->ptr_ + sVar2,begin,uVar4 * 4);
      sVar2 = this->size_;
    }
    this->size_ = sVar2 + uVar4;
  }
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  while (begin != end) {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, make_checked(ptr_ + size_, count));
    size_ += count;
    begin += count;
  }
}